

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  MaterialFileReader *pMVar4;
  istream *piVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  size_type *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  string filepath_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string filepath;
  string s;
  stringstream ss;
  istringstream f;
  char *local_458;
  long local_450;
  char local_448 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  string *local_420;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  value_type local_3f0;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> *local_3d0;
  MaterialFileReader *local_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  byte abStack_3a0 [96];
  ios_base local_340 [392];
  istringstream local_1b8 [16];
  ostream local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  local_418 = matMap;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    pcVar3 = (matId->_M_dataplus)._M_p;
    psVar10 = warn;
    local_458 = local_448;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar3,pcVar3 + matId->_M_string_length);
    std::ifstream::ifstream(&local_3c0,local_458,_S_in);
    bVar13 = (abStack_3a0[local_3c0[-3]] & 5) == 0;
    if (bVar13) {
      LoadMtl(local_418,materials,(istream *)&local_3c0,warn,psVar10);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Material file [ ",0x10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_458,local_450);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ] not found in a path : ",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(this->m_mtlBaseDir)._M_dataplus._M_p,
                          (this->m_mtlBaseDir)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)warn,(ulong)local_3f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    std::ifstream::~ifstream(&local_3c0);
    if (local_458 != local_448) {
      operator_delete(local_458);
    }
  }
  else {
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar10 = warn;
    local_3d0 = materials;
    std::__cxx11::istringstream::istringstream(local_1b8,(string *)&this->m_mtlBaseDir,_S_in);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0._M_string_length = 0;
    local_3f0.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)&local_3f0,':');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_438,&local_3f0);
    }
    bVar13 = local_438.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_438.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_420 = warn;
    local_3c8 = this;
    if (bVar13) {
      paVar1 = &local_410.field_2;
      lVar11 = 0;
      uVar12 = 0;
      do {
        lVar2 = *(long *)((long)&(local_438.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar11);
        if (lVar2 == 0) {
          pcVar3 = (matId->_M_dataplus)._M_p;
          local_410._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_410,pcVar3,pcVar3 + matId->_M_string_length);
        }
        else {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&((local_438.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11);
          if ((__lhs->_M_dataplus)._M_p[lVar2 + -1] == '/') {
            std::operator+(&local_410,__lhs,matId);
          }
          else {
            local_458 = local_448;
            local_448[0] = '/';
            local_448[1] = '\0';
            local_450 = 1;
            psVar10 = (string *)__lhs->_M_string_length;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_458,0,(char *)0x0,
                                        (ulong)(__lhs->_M_dataplus)._M_p);
            local_3c0 = &local_3b0;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_3b0 = *plVar8;
              lStack_3a8 = plVar6[3];
            }
            else {
              local_3b0 = *plVar8;
              local_3c0 = (long *)*plVar6;
            }
            local_3b8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_3c0,(ulong)(matId->_M_dataplus)._M_p);
            psVar9 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_410.field_2._M_allocated_capacity = *psVar9;
              local_410.field_2._8_8_ = plVar6[3];
              local_410._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_410.field_2._M_allocated_capacity = *psVar9;
              local_410._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_410._M_string_length = plVar6[1];
            *plVar6 = (long)psVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (local_3c0 != &local_3b0) {
              operator_delete(local_3c0);
            }
            if (local_458 != local_448) {
              operator_delete(local_458);
            }
          }
        }
        std::ifstream::ifstream(&local_3c0,local_410._M_dataplus._M_p,_S_in);
        if ((abStack_3a0[local_3c0[-3]] & 5) == 0) {
          LoadMtl(local_418,local_3d0,(istream *)&local_3c0,local_420,psVar10);
          std::ifstream::~ifstream(&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar1) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          goto LAB_0021fe7f;
        }
        std::ifstream::~ifstream(&local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != paVar1) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x20;
        bVar13 = uVar12 < (ulong)((long)local_438.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_438.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
      } while (bVar13);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b0,"Material file [ ",0x10);
    pMVar4 = local_3c8;
    psVar10 = local_420;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_3b0,(matId->_M_dataplus)._M_p,matId->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ] not found in a path : ",0x19);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(pMVar4->m_mtlBaseDir)._M_dataplus._M_p,
                        (pMVar4->m_mtlBaseDir)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (psVar10 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_458);
      if (local_458 != local_448) {
        operator_delete(local_458);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
    std::ios_base::~ios_base(local_340);
LAB_0021fe7f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream(local_1b8);
    std::ios_base::~ios_base(local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
  }
  return bVar13;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}